

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O1

void __thiscall crnlib::dynamic_string::translate_lf_to_crlf(dynamic_string *this)

{
  char c;
  uint16 uVar1;
  uint16 uVar2;
  ushort uVar3;
  char *pcVar4;
  ulong uVar5;
  char cVar6;
  dynamic_string tmp;
  dynamic_string local_38;
  
  uVar3 = this->m_len;
  if ((ulong)uVar3 != 0) {
    uVar5 = 0;
    do {
      if (this->m_pStr[uVar5] == '\n') {
        local_38.m_buf_size = 0;
        local_38.m_len = 0;
        local_38.m_pStr = (char *)0x0;
        if (uVar3 < 0xfffd) {
          expand_buf(&local_38,uVar3 + 3,true);
        }
        uVar3 = this->m_len;
        if (uVar3 != 0) {
          uVar5 = 0;
          cVar6 = -1;
          do {
            pcVar4 = this->m_pStr;
            if (pcVar4 == (char *)0x0) {
              pcVar4 = "";
            }
            c = pcVar4[uVar5];
            if (cVar6 != '\r' && c == '\n') {
              append_char(&local_38,'\r');
            }
            append_char(&local_38,c);
            uVar5 = uVar5 + 1;
            uVar3 = this->m_len;
            cVar6 = c;
          } while (uVar5 < uVar3);
        }
        uVar1 = this->m_buf_size;
        uVar2 = local_38.m_len;
        this->m_buf_size = local_38.m_buf_size;
        local_38.m_len = uVar3;
        local_38.m_buf_size = uVar1;
        this->m_len = uVar2;
        pcVar4 = this->m_pStr;
        this->m_pStr = local_38.m_pStr;
        if (pcVar4 == (char *)0x0) {
          return;
        }
        if ((*(uint *)(pcVar4 + -8) ^ *(uint *)(pcVar4 + -4)) != 0xffffffff) {
          return;
        }
        local_38.m_pStr = pcVar4;
        crnlib_free(pcVar4 + -0x10);
        return;
      }
      uVar5 = uVar5 + 1;
    } while (uVar3 != uVar5);
  }
  return;
}

Assistant:

void dynamic_string::translate_lf_to_crlf()
    {
        if (find_left(0x0A) < 0)
        {
            return;
        }

        dynamic_string tmp;
        tmp.ensure_buf(m_len + 2);

        // normal sequence is 0x0D 0x0A (CR LF, \r\n)

        int prev_char = -1;
        for (uint i = 0; i < get_len(); i++)
        {
            const int cur_char = (*this)[i];

            if ((cur_char == 0x0A) && (prev_char != 0x0D))
            {
                tmp.append_char(0x0D);
            }

            tmp.append_char(cur_char);

            prev_char = cur_char;
        }

        swap(tmp);
    }